

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetatype.cpp
# Opt level: O2

QMetaType __thiscall QMetaType::underlyingType(QMetaType *this)

{
  QMetaTypeInterface *pQVar1;
  uint uVar2;
  undefined **ppuVar3;
  
  pQVar1 = this->d_ptr;
  if (((pQVar1 != (QMetaTypeInterface *)0x0) && ((pQVar1->flags & 0x10) != 0)) &&
     (uVar2 = pQVar1->size - 1, uVar2 < 8)) {
    ppuVar3 = &PTR_metaType_006650e0;
    if ((pQVar1->flags >> 8 & 1) == 0) {
      ppuVar3 = &PTR_metaType_00665120;
    }
    return (QMetaType)(QMetaTypeInterface *)ppuVar3[uVar2];
  }
  return (QMetaType)(QMetaTypeInterface *)0x0;
}

Assistant:

QMetaType QMetaType::underlyingType() const
{
    if (!d_ptr || !(flags() & IsEnumeration))
        return {};
    /* QFlags has enumeration set so that's handled here (qint32
       case), as QFlags uses int as the underlying type
       Note that we do some approximation here, as we cannot
       differentiate between different underlying types of the
       same size and signedness (consider char <-> (un)signed char,
       int <-> long <-> long long).
    */
    if (flags() & IsUnsignedEnumeration) {
        switch (sizeOf()) {
        case 1:
            return QMetaType::fromType<quint8>();
        case 2:
            return QMetaType::fromType<quint16>();
        case 4:
            return QMetaType::fromType<quint32>();
        case 8:
            return QMetaType::fromType<quint64>();
        default:
            break;
        }
    } else {
        switch (sizeOf()) {
        case 1:
            return QMetaType::fromType<qint8>();
        case 2:
            return QMetaType::fromType<qint16>();
        case 4:
            return QMetaType::fromType<qint32>();
        case 8:
            return QMetaType::fromType<qint64>();
        default:
            break;
        }
    }
    // int128 can be handled above once we have qint128
    return QMetaType();
}